

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O3

Error __thiscall
asmjit::BaseCompiler::_newReg(BaseCompiler *this,BaseReg *out,BaseReg *ref,char *name)

{
  byte bVar1;
  uint32_t uVar2;
  uint uVar3;
  Error EVar4;
  uint uVar5;
  uint32_t typeId;
  RegInfo regInfo;
  VirtReg *vReg;
  uint32_t local_28;
  RegInfo local_24;
  VirtReg *local_20;
  
  (out->super_Operand).super_Operand_._signature = 0;
  (out->super_Operand).super_Operand_._baseId = 0;
  (out->super_Operand).super_Operand_._data[0] = 0;
  (out->super_Operand).super_Operand_._data[1] = 0;
  uVar3 = (ref->super_Operand).super_Operand_._baseId - 0x100;
  if (uVar3 < (this->_vRegArray).super_ZoneVectorBase._size) {
    bVar1 = *(byte *)(*(long *)((long)(this->_vRegArray).super_ZoneVectorBase._data +
                               (ulong)uVar3 * 8) + 0xd);
    local_28 = (uint32_t)bVar1;
    uVar3 = (ref->super_Operand).super_Operand_._signature >> 0x18;
    if (uVar3 != (byte)Type::_typeData[(ulong)bVar1 + 0x100]) {
      if (bVar1 - 0x20 < 10) {
        if (7 < uVar3 - 1) {
switchD_00115d47_caseD_3:
          EVar4 = BaseEmitter::reportError((BaseEmitter *)this,3,(char *)0x0);
          return EVar4;
        }
        uVar5 = (uint)bVar1;
        switch(uVar3) {
        case 1:
          local_28 = uVar5 & 1 | 0x22;
          break;
        case 2:
          local_28 = uVar5 & 1 | 0x24;
          break;
        default:
          goto switchD_00115d47_caseD_3;
        case 4:
          local_28 = uVar5 & 1 | 0x26;
          break;
        case 8:
          local_28 = local_28 & 1 | 0x28;
        }
      }
      else if (bVar1 - 0x31 < 2) {
        local_28 = 0x32;
      }
      else if (bVar1 - 0x2d < 4) {
        switch(uVar3) {
        case 1:
          local_28 = 0x2d;
          break;
        case 2:
          local_28 = 0x2e;
          break;
        default:
          goto switchD_00115d47_caseD_3;
        case 4:
          local_28 = 0x2f;
          break;
        case 8:
          local_28 = 0x30;
        }
      }
      else {
        bVar1 = Type::_typeData[bVar1];
        if (uVar3 == 0x40) {
          local_28 = bVar1 + 0x39;
        }
        else if (uVar3 == 0x20) {
          local_28 = bVar1 + 0x2f;
        }
        else {
          if (uVar3 != 0x10) goto switchD_00115d47_caseD_3;
          local_28 = bVar1 + 0x25;
        }
      }
    }
  }
  else {
    local_28 = (ref->super_Operand).super_Operand_._signature >> 3 & 0x1f;
  }
  EVar4 = ArchUtils::typeIdToRegInfo
                    ((uint)(this->super_BaseBuilder).super_BaseEmitter._environment._arch,local_28,
                     &local_28,&local_24);
  if (EVar4 == 0) {
    EVar4 = newVirtReg(this,&local_20,local_28,local_24._signature,name);
    if (EVar4 == 0) {
      uVar2 = local_20->_id;
      (out->super_Operand).super_Operand_._signature = local_24._signature;
      (out->super_Operand).super_Operand_._baseId = uVar2;
      (out->super_Operand).super_Operand_._data[0] = 0;
      (out->super_Operand).super_Operand_._data[1] = 0;
    }
  }
  else {
    EVar4 = BaseEmitter::reportError((BaseEmitter *)this,EVar4,(char *)0x0);
  }
  return EVar4;
}

Assistant:

Error BaseCompiler::_newReg(BaseReg* out, const BaseReg& ref, const char* name) {
  out->reset();

  RegInfo regInfo;
  uint32_t typeId;

  if (isVirtRegValid(ref)) {
    VirtReg* vRef = virtRegByReg(ref);
    typeId = vRef->typeId();

    // NOTE: It's possible to cast one register type to another if it's the
    // same register group. However, VirtReg always contains the TypeId that
    // was used to create the register. This means that in some cases we may
    // end up having different size of `ref` and `vRef`. In such case we
    // adjust the TypeId to match the `ref` register type instead of the
    // original register type, which should be the expected behavior.
    uint32_t typeSize = Type::sizeOf(typeId);
    uint32_t refSize = ref.size();

    if (typeSize != refSize) {
      if (Type::isInt(typeId)) {
        // GP register - change TypeId to match `ref`, but keep sign of `vRef`.
        switch (refSize) {
          case  1: typeId = Type::kIdI8  | (typeId & 1); break;
          case  2: typeId = Type::kIdI16 | (typeId & 1); break;
          case  4: typeId = Type::kIdI32 | (typeId & 1); break;
          case  8: typeId = Type::kIdI64 | (typeId & 1); break;
          default: typeId = Type::kIdVoid; break;
        }
      }
      else if (Type::isMmx(typeId)) {
        // MMX register - always use 64-bit.
        typeId = Type::kIdMmx64;
      }
      else if (Type::isMask(typeId)) {
        // Mask register - change TypeId to match `ref` size.
        switch (refSize) {
          case  1: typeId = Type::kIdMask8; break;
          case  2: typeId = Type::kIdMask16; break;
          case  4: typeId = Type::kIdMask32; break;
          case  8: typeId = Type::kIdMask64; break;
          default: typeId = Type::kIdVoid; break;
        }
      }
      else {
        // VEC register - change TypeId to match `ref` size, keep vector metadata.
        uint32_t elementTypeId = Type::baseOf(typeId);

        switch (refSize) {
          case 16: typeId = Type::_kIdVec128Start + (elementTypeId - Type::kIdI8); break;
          case 32: typeId = Type::_kIdVec256Start + (elementTypeId - Type::kIdI8); break;
          case 64: typeId = Type::_kIdVec512Start + (elementTypeId - Type::kIdI8); break;
          default: typeId = Type::kIdVoid; break;
        }
      }

      if (typeId == Type::kIdVoid)
        return reportError(DebugUtils::errored(kErrorInvalidState));
    }
  }
  else {
    typeId = ref.type();
  }

  Error err = ArchUtils::typeIdToRegInfo(arch(), typeId, &typeId, &regInfo);
  if (ASMJIT_UNLIKELY(err))
    return reportError(err);

  VirtReg* vReg;
  ASMJIT_PROPAGATE(newVirtReg(&vReg, typeId, regInfo.signature(), name));

  out->_initReg(regInfo.signature(), vReg->id());
  return kErrorOk;
}